

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

_Bool bitset_grow(bitset_t *bitset,size_t newarraysize)

{
  void *pvVar1;
  ulong in_RSI;
  long *in_RDI;
  size_t newcapacity;
  uint64_t *newarray;
  ulong local_28;
  _Bool local_1;
  
  if (in_RSI < (ulong)in_RDI[1]) {
    local_1 = false;
  }
  else if (in_RSI < 0x400000000000000) {
    if ((ulong)in_RDI[2] < in_RSI) {
      local_28 = in_RDI[2];
      if (local_28 == 0) {
        local_28 = 1;
      }
      for (; local_28 < in_RSI; local_28 = local_28 << 1) {
      }
      pvVar1 = realloc((void *)*in_RDI,local_28 << 3);
      if (pvVar1 == (void *)0x0) {
        return false;
      }
      in_RDI[2] = local_28;
      *in_RDI = (long)pvVar1;
    }
    memset((void *)(*in_RDI + in_RDI[1] * 8),0,(in_RSI - in_RDI[1]) * 8);
    in_RDI[1] = in_RSI;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool bitset_grow(bitset_t *bitset,  size_t newarraysize) {
  if(newarraysize < bitset->arraysize) { return false; }
  if(newarraysize > SIZE_MAX/64) { return false; }
  if (bitset->capacity < newarraysize) {
    uint64_t *newarray;
    size_t newcapacity = bitset->capacity;
    if(newcapacity == 0) { newcapacity = 1; }
    while(newcapacity < newarraysize) { newcapacity *= 2; }
    if ((newarray = (uint64_t *) realloc(bitset->array, sizeof(uint64_t) * newcapacity)) == NULL) {
      return false;
    }
    bitset->capacity = newcapacity;
    bitset->array = newarray;
  }
  memset(bitset->array + bitset->arraysize, 0, sizeof(uint64_t) * (newarraysize - bitset->arraysize));
  bitset->arraysize = newarraysize;
  return true; // success!
}